

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O2

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::finalize
          (iterated_hash<crypto::sha1_transform> *this,char *result)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  pad(this,0x38,-0x80);
  uVar2 = this->count_lo;
  uVar1 = uVar2 * 8;
  uVar3 = this->count_hi << 3;
  *(uint *)(this->buffer + 0x3c) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar2 << 0x1b;
  *(uint *)(this->buffer + 0x38) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
       (uVar3 | uVar2 >> 0x1d) << 0x18;
  hash(this->state,this->buffer,0x40);
  util::endianness<util::big_endian>::store<unsigned_int>(this->state,5,result);
  return;
}

Assistant:

void iterated_hash<T>::finalize(char * result) {
	
	size_t order = transform::offset * sizeof(hash_word);
	
	size_t size = block_size - 2 * sizeof(hash_word);
	pad(size);
	byte_order::store(bit_count_lo(), buffer + size + order);
	byte_order::store(bit_count_hi(), buffer + size + sizeof(hash_word) - order);
	
	hash(state, buffer, block_size);
	
	byte_order::store(state, hash_size, result);
	
}